

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  stbi_uc sVar6;
  byte bVar7;
  byte bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  stbi_uc *psVar19;
  byte bVar20;
  undefined4 in_register_0000000c;
  ulong uVar21;
  char *pcVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint n;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  size_t __n;
  stbi_uc (*pal) [4];
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar23 = stbi__gif_header(s,g,comp,0);
    if (iVar23 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar23 = g->w;
    iVar17 = g->h;
    iVar24 = stbi__mad3sizes_valid(4,iVar23,iVar17,0);
    if (iVar24 == 0) {
      stbi__g_failure_reason = "too large";
      return (stbi_uc *)0x0;
    }
    iVar17 = iVar17 * iVar23;
    __n = (size_t)(iVar17 * 4);
    psVar19 = (stbi_uc *)SDL_malloc(__n);
    g->out = psVar19;
    psVar19 = (stbi_uc *)SDL_malloc(__n);
    g->background = psVar19;
    psVar19 = (stbi_uc *)SDL_malloc((long)iVar17);
    g->history = psVar19;
    pcVar22 = "outofmem";
    if (g->out == (stbi_uc *)0x0) {
      stbi__g_failure_reason = pcVar22;
      return (stbi_uc *)0x0;
    }
    if (g->background == (stbi_uc *)0x0) {
      stbi__g_failure_reason = pcVar22;
      return (stbi_uc *)0x0;
    }
    if (psVar19 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = pcVar22;
      return (stbi_uc *)0x0;
    }
    memset(g->out,0,__n);
    memset(g->background,0,__n);
    memset(g->history,0,(long)iVar17);
  }
  else {
    uVar28 = (uint)g->eflags >> 2 & 7;
    uVar16 = g->h * g->w;
    uVar30 = 2;
    if (uVar28 != 3) {
      uVar30 = uVar28;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar30 = uVar28;
    }
    if (uVar30 == 3) {
      if (0 < (int)uVar16) {
        uVar21 = 0;
        do {
          if (g->history[uVar21] != '\0') {
            *(undefined4 *)(g->out + uVar21 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar21 * 4);
          }
          uVar21 = uVar21 + 1;
        } while (uVar16 != uVar21);
      }
    }
    else if ((uVar30 == 2) && (0 < (int)uVar16)) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] != '\0') {
          *(undefined4 *)(g->out + uVar21 * 4) = *(undefined4 *)(g->background + uVar21 * 4);
        }
        uVar21 = uVar21 + 1;
      } while (uVar16 != uVar21);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
  }
  memset(g->history,0,(long)g->h * (long)g->w);
  pal = g->pal;
  while (sVar6 = stbi__get8(s), sVar6 == '!') {
    sVar6 = stbi__get8(s);
    if (sVar6 == 0xf9) {
      bVar7 = stbi__get8(s);
      if (bVar7 == 4) {
        bVar7 = stbi__get8(s);
        g->eflags = (uint)bVar7;
        bVar7 = stbi__get8(s);
        bVar8 = stbi__get8(s);
        g->delay = ((uint)bVar8 * 0x200 + (uint)bVar7 * 2) * 5;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          bVar7 = stbi__get8(s);
          g->transparent = (uint)bVar7;
          g->pal[bVar7][3] = '\0';
          goto LAB_0010f9f6;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar19 = s->img_buffer;
LAB_0010f9d7:
          s->img_buffer = psVar19 + 1;
        }
        else {
          psVar19 = s->img_buffer;
          iVar23 = (int)s->img_buffer_end - (int)psVar19;
          if (0 < iVar23) goto LAB_0010f9d7;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar23);
        }
        g->transparent = -1;
        goto LAB_0010f9f6;
      }
      stbi__skip(s,(uint)bVar7);
    }
    else {
LAB_0010f9f6:
      while (bVar7 = stbi__get8(s), bVar7 != 0) {
        stbi__skip(s,(uint)bVar7);
      }
    }
  }
  if (sVar6 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar6 != ',') {
    stbi__g_failure_reason = "unknown code";
    return (stbi_uc *)0x0;
  }
  sVar6 = stbi__get8(s);
  sVar9 = stbi__get8(s);
  sVar10 = stbi__get8(s);
  sVar11 = stbi__get8(s);
  sVar12 = stbi__get8(s);
  sVar13 = stbi__get8(s);
  sVar14 = stbi__get8(s);
  sVar15 = stbi__get8(s);
  iVar23 = (uint)CONCAT11(sVar13,sVar12) + (uint)CONCAT11(sVar9,sVar6);
  if (g->w < iVar23) {
    stbi__g_failure_reason = "bad Image Descriptor";
    return (stbi_uc *)0x0;
  }
  iVar17 = (uint)CONCAT11(sVar15,sVar14) + (uint)CONCAT11(sVar11,sVar10);
  if (g->h < iVar17) {
    stbi__g_failure_reason = "bad Image Descriptor";
    return (stbi_uc *)0x0;
  }
  iVar24 = g->w * 4;
  g->line_size = iVar24;
  iVar27 = (uint)CONCAT11(sVar9,sVar6) << 2;
  g->start_x = iVar27;
  iVar29 = (uint)CONCAT11(sVar11,sVar10) * iVar24;
  g->start_y = iVar29;
  g->max_x = iVar23 * 4;
  iVar17 = iVar17 * iVar24;
  g->max_y = iVar17;
  g->cur_x = iVar27;
  if (CONCAT11(sVar13,sVar12) != 0) {
    iVar17 = iVar29;
  }
  g->cur_y = iVar17;
  bVar7 = stbi__get8(s);
  g->lflags = (uint)bVar7;
  iVar23 = g->line_size * 8;
  if ((bVar7 & 0x40) == 0) {
    iVar23 = g->line_size;
  }
  g->step = iVar23;
  g->parse = (int)((uint)bVar7 << 0x19) >> 0x1f & 3;
  if ((char)bVar7 < '\0') {
    pal = g->lpal;
    iVar23 = -1;
    if ((g->eflags & 1) != 0) {
      iVar23 = g->transparent;
    }
    stbi__gif_parse_colortable(s,pal,2 << (bVar7 & 7),iVar23);
  }
  else if ((g->flags & 0x80) == 0) {
    stbi__g_failure_reason = "missing color table";
    return (stbi_uc *)0x0;
  }
  g->color_table = *pal;
  bVar7 = stbi__get8(s);
  if (0xc < bVar7) {
    return (stbi_uc *)0x0;
  }
  uVar30 = 1 << (bVar7 & 0x1f);
  uVar21 = 0;
  do {
    g->codes[uVar21].prefix = -1;
    g->codes[uVar21].first = (stbi_uc)uVar21;
    g->codes[uVar21].suffix = (stbi_uc)uVar21;
    uVar21 = uVar21 + 1;
  } while (uVar30 != uVar21);
  uVar31 = (2 << (bVar7 & 0x1f)) - 1;
  n = 0;
  iVar23 = 0;
  uVar16 = 0;
  bVar3 = false;
  uVar28 = uVar30 + 2;
  uVar4 = 0xffffffff;
  iVar17 = bVar7 + 1;
  uVar5 = uVar31;
  while( true ) {
    do {
      for (; uVar18 = uVar5, iVar24 = iVar17, uVar25 = uVar4, uVar26 = uVar28, bVar2 = bVar3,
          iVar17 = iVar23 - iVar24, iVar23 < iVar24; iVar23 = iVar23 + 8) {
        if (n == 0) {
          bVar8 = stbi__get8(s);
          if (bVar8 == 0) goto LAB_0010fdd2;
          n = (uint)bVar8;
        }
        n = n - 1;
        bVar8 = stbi__get8(s);
        bVar20 = (byte)iVar23;
        uVar16 = uVar16 | (uint)bVar8 << (bVar20 & 0x1f);
        bVar3 = bVar2;
        uVar28 = uVar26;
        uVar4 = uVar25;
        iVar17 = iVar24;
        uVar5 = uVar18;
      }
      uVar28 = (int)uVar16 >> ((byte)iVar24 & 0x1f);
      uVar32 = uVar16 & uVar18;
      iVar23 = iVar17;
      uVar16 = uVar28;
      bVar3 = true;
      uVar28 = uVar30 + 2;
      uVar4 = 0xffffffff;
      iVar17 = bVar7 + 1;
      uVar5 = uVar31;
    } while (uVar32 == uVar30);
    if (uVar32 == uVar30 + 1) break;
    if ((int)uVar26 < (int)uVar32) {
      stbi__g_failure_reason = "illegal code in raster";
      return (stbi_uc *)0x0;
    }
    if (!bVar2) {
      stbi__g_failure_reason = "no clear code";
      return (stbi_uc *)0x0;
    }
    if ((int)uVar25 < 0) {
      if (uVar32 == uVar26) {
        stbi__g_failure_reason = "illegal code in raster";
        return (stbi_uc *)0x0;
      }
    }
    else {
      if (0x1fff < (int)uVar26) {
        stbi__g_failure_reason = "too many codes";
        return (stbi_uc *)0x0;
      }
      g->codes[(int)uVar26].prefix = (stbi__int16)uVar25;
      sVar6 = g->codes[uVar25].first;
      g->codes[(int)uVar26].first = sVar6;
      if (uVar32 != uVar26 + 1) {
        sVar6 = g->codes[(int)uVar32].first;
      }
      g->codes[(int)uVar26].suffix = sVar6;
      uVar26 = uVar26 + 1;
    }
    stbi__out_gif_code(g,(stbi__uint16)uVar32);
    bVar3 = true;
    uVar28 = uVar26;
    uVar4 = uVar32;
    iVar17 = iVar24 + 1;
    uVar5 = ~(-1 << ((byte)(iVar24 + 1) & 0x1f));
    if (0xfff < (int)uVar26 || (uVar26 & uVar18) != 0) {
      iVar17 = iVar24;
      uVar5 = uVar18;
    }
  }
  while( true ) {
    stbi__skip(s,n);
    bVar7 = stbi__get8(s);
    if (bVar7 == 0) break;
    n = (uint)bVar7;
  }
LAB_0010fdd2:
  psVar19 = g->out;
  if (psVar19 == (stbi_uc *)0x0) {
    return (stbi_uc *)0x0;
  }
  if (psVar1 == (stbi_uc *)0x0) {
    uVar30 = g->h * g->w;
    if (0 < (int)uVar30 && 0 < g->bgindex) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] == '\0') {
          g->pal[g->bgindex][3] = 0xff;
          *(stbi_uc (*) [4])(g->out + uVar21 * 4) = g->pal[g->bgindex];
        }
        uVar21 = uVar21 + 1;
      } while (uVar30 != uVar21);
      return psVar19;
    }
    return psVar19;
  }
  return psVar19;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}